

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.cc
# Opt level: O2

void __thiscall KmerCounter::read_counts(KmerCounter *this,ifstream *count_file)

{
  std::istream::read((char *)count_file,(long)&this->k);
  std::istream::read((char *)count_file,(long)&this->count_mode);
  sdglib::read_string(count_file,&this->name);
  sdglib::read_stringvector(count_file,&this->count_names);
  if (this->k < ' ') {
    sdglib::read_flat_vector<unsigned_long>(count_file,&this->kindex);
  }
  else {
    sdglib::read_flat_vector<unsigned__int128>(count_file,&this->kindex128);
  }
  sdglib::read_flat_vectorvector<unsigned_short>(count_file,&this->counts);
  return;
}

Assistant:

void KmerCounter::read_counts(std::ifstream &count_file) {
    count_file.read((char *) &k, sizeof(k));
    count_file.read((char *) &count_mode, sizeof(count_mode));
    sdglib::read_string(count_file,name);
    sdglib::read_stringvector(count_file,count_names);
    if (k<=31) sdglib::read_flat_vector(count_file,kindex);
    else sdglib::read_flat_vector(count_file,kindex128);
    sdglib::read_flat_vectorvector(count_file,counts);
}